

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O2

FArchive * operator<<(FArchive *arc,FState **state)

{
  DWORD DVar1;
  PClassActor *type;
  FState *pFVar2;
  PClassActor *info;
  
  if (arc->m_Storing == true) {
    if (*state == (FState *)0x0) {
      FArchive::UserWriteClass(arc,AActor::RegistrationInfo.MyClass);
      DVar1 = 0x7f;
    }
    else {
      type = FState::StaticFindStateOwner(*state);
      if (type == (PClassActor *)0x0) {
        return arc;
      }
      FArchive::UserWriteClass(arc,&type->super_PClass);
      DVar1 = (DWORD)(((long)*state - (long)type->OwnedStates) / 0x28);
    }
    FArchive::WriteCount(arc,DVar1);
  }
  else {
    FArchive::UserReadClass<PClassActor>(arc,&info);
    DVar1 = FArchive::ReadCount(arc);
    if ((DVar1 == 0x7f) && (info == (PClassActor *)AActor::RegistrationInfo.MyClass)) {
      pFVar2 = (FState *)0x0;
    }
    else {
      pFVar2 = info->OwnedStates + DVar1;
    }
    *state = pFVar2;
  }
  return arc;
}

Assistant:

FArchive &operator<< (FArchive &arc, FState *&state)
{
	PClassActor *info;

	if (arc.IsStoring ())
	{
		if (state == NULL)
		{
			arc.UserWriteClass (RUNTIME_CLASS(AActor));
			arc.WriteCount (NULL_STATE_INDEX);
			return arc;
		}

		info = FState::StaticFindStateOwner (state);

		if (info != NULL)
		{
			arc.UserWriteClass (info);
			arc.WriteCount ((DWORD)(state - info->OwnedStates));
		}
		else
		{
			/* this was never working as intended.
			I_Error ("Cannot find owner for state %p:\n"
					 "%s %c%c %3d [%p] -> %p", state,
					 sprites[state->sprite].name,
					 state->GetFrame() + 'A',
					 state->GetFullbright() ? '*' : ' ',
					 state->GetTics(),
					 state->GetAction(),
					 state->GetNextState());
			*/
		}
	}
	else
	{
		PClassActor *info;
		DWORD ofs;

		arc.UserReadClass<PClassActor>(info);
		ofs = arc.ReadCount ();
		if (ofs == NULL_STATE_INDEX && info == RUNTIME_CLASS(AActor))
		{
			state = NULL;
		}
		else
		{
			state = info->OwnedStates + ofs;
		}
	}
	return arc;
}